

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example5.cpp
# Opt level: O3

void checkerror(int rtperr)

{
  ostream *poVar1;
  int errcode;
  string local_38;
  
  if (-1 < rtperr) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR: ",7);
  jrtplib::RTPGetErrorString_abi_cxx11_(&local_38,(jrtplib *)(ulong)(uint)rtperr,errcode);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_38);
  exit(-1);
}

Assistant:

void checkerror(int rtperr)
{
	if (rtperr < 0)
	{
		std::cout << "ERROR: " << RTPGetErrorString(rtperr) << std::endl;
		exit(-1);
	}
}